

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::TasmanianSparseGrid::getPoints
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianSparseGrid *this
          )

{
  TasmanianSparseGrid *this_local;
  vector<double,_std::allocator<double>_> *x;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  getPoints(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getPoints() const{ std::vector<double> x; getPoints(x); return x; }